

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

int __thiscall iDynTree::Model::copy(Model *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  long lVar2;
  LinkIndex linkIndex;
  SensorsList *pSVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  string linkName;
  string frameName;
  Transform link_H_frame;
  string local_130;
  string local_110;
  Transform local_f0 [96];
  
  this->defaultBaseLink = LINK_INVALID_INDEX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->packageDirs,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(dst + 200));
  lVar2 = *(long *)(dst + 8);
  if (*(long *)(dst + 0x10) != lVar2) {
    uVar7 = 1;
    uVar5 = 0;
    do {
      addLink(this,(string *)(uVar5 * 0x20 + *(long *)(dst + 0x68)),(Link *)(uVar5 * 0x70 + lVar2));
      uVar5 = (ulong)uVar7;
      lVar2 = *(long *)(dst + 8);
      uVar4 = (*(long *)(dst + 0x10) - lVar2 >> 4) * 0x6db6db6db6db6db7;
      uVar7 = uVar7 + 1;
    } while (uVar5 <= uVar4 && uVar4 - uVar5 != 0);
  }
  this->nrOfPosCoords = 0;
  this->nrOfDOFs = 0;
  lVar2 = *(long *)(dst + 0x20);
  if (*(long *)(dst + 0x28) != lVar2) {
    uVar5 = 0;
    uVar4 = 1;
    do {
      addJoint(this,(string *)(uVar5 * 0x20 + *(long *)(dst + 0x80)),
               *(IJointConstPtr *)(lVar2 + uVar5 * 8));
      lVar2 = *(long *)(dst + 0x20);
      bVar1 = uVar4 < (ulong)(*(long *)(dst + 0x28) - lVar2 >> 3);
      uVar5 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar1);
  }
  for (uVar7 = (int)((ulong)(*(long *)(dst + 0x10) - *(long *)(dst + 8)) >> 4) * -0x49249249;
      uVar5 = (ulong)uVar7,
      uVar5 < (ulong)((*(long *)(dst + 0x40) - *(long *)(dst + 0x38) >> 5) * -0x5555555555555555 +
                     (*(long *)(dst + 0x10) - *(long *)(dst + 8) >> 4) * 0x6db6db6db6db6db7);
      uVar7 = uVar7 + 1) {
    linkIndex = getFrameLink((Model *)dst,uVar5);
    getLinkName_abi_cxx11_(&local_130,(Model *)dst,linkIndex);
    getFrameName_abi_cxx11_(&local_110,(Model *)dst,uVar5);
    getFrameTransform((Model *)&stack0xffffffffffffff70,(FrameIndex)dst);
    iDynTree::Transform::Transform(local_f0,(Transform *)&stack0xffffffffffffff70);
    addAdditionalFrameToLink(this,&local_130,&local_110,local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
  }
  lVar2 = *(long *)(dst + 0xe0);
  if ((-1 < lVar2) &&
     (lVar6 = ((long)(this->links).
                     super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->links).
                     super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl.
                     super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7,
     lVar6 - lVar2 != 0 && lVar2 <= lVar6)) {
    this->defaultBaseLink = lVar2;
  }
  ModelSolidShapes::operator=(&this->m_collisionSolidShapes,(ModelSolidShapes *)(dst + 0x108));
  ModelSolidShapes::operator=(&this->m_visualSolidShapes,(ModelSolidShapes *)(dst + 0xf0));
  pSVar3 = SensorsList::operator=(&this->m_sensors,(SensorsList *)(dst + 0x120));
  return (int)pSVar3;
}

Assistant:

void Model::copy(const Model& other)
{
    // reset the base link, the real one will be copied later
    this->defaultBaseLink = LINK_INVALID_INDEX;

    this->packageDirs = other.packageDirs;

    // Add all the links, preserving the numbering
    for(unsigned int lnk=0; lnk < other.getNrOfLinks(); lnk++ )
    {
        this->addLink(other.linkNames[lnk],other.links[lnk]);
    }

    // Add all joints, preserving the numbering
    // reset the nrOfDOFs (it will be then update in addJoint)
    nrOfPosCoords = 0;
    nrOfDOFs = 0;

    for(unsigned int jnt=0; jnt < other.getNrOfJoints(); jnt++ )
    {
        this->addJoint(other.jointNames[jnt],other.joints[jnt]);
    }

    // Add all additional frames, preserving the numbering
    for(unsigned int addFrm=other.getNrOfLinks(); addFrm < other.getNrOfFrames(); addFrm++ )
    {
        std::string linkName = other.getLinkName(other.getFrameLink(addFrm));
        std::string frameName = other.getFrameName(addFrm);
        Transform link_H_frame = other.getFrameTransform(addFrm);
        this->addAdditionalFrameToLink(linkName,frameName,link_H_frame);
    }

    // Copy the default base link
    this->setDefaultBaseLink(other.getDefaultBaseLink());

    // Copy the solid shapes
    this->m_collisionSolidShapes = other.m_collisionSolidShapes;
    this->m_visualSolidShapes    = other.m_visualSolidShapes;

    // Copy the sensors
    this->m_sensors = other.m_sensors;
}